

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_state.cc
# Opt level: O3

void pgraph_load_pipe(int cnum,uint32_t addr,uint32_t *data,int num)

{
  void *pvVar1;
  nva_card **ppnVar2;
  int iVar3;
  ulong uVar4;
  bool bVar5;
  
  ppnVar2 = nva_cards;
  pvVar1 = nva_cards[cnum]->bar0;
  *(uint32_t *)((long)pvVar1 + 0x400f50) = addr;
  if (0 < num) {
    uVar4 = 0;
    do {
      *(uint32_t *)((long)pvVar1 + 0x400f54) = data[uVar4];
      uVar4 = uVar4 + 1;
    } while ((uint)num != uVar4);
  }
  if (*(int *)((long)pvVar1 + 0x400700) != 0) {
    iVar3 = 9999;
    do {
      bVar5 = iVar3 == 0;
      iVar3 = iVar3 + -1;
      if (bVar5) {
        printf("PIPE write hang on %04x: %08x\n",addr,(ulong)*(uint *)((long)pvVar1 + 0x400700));
        ppnVar2 = nva_cards;
      }
      pvVar1 = ppnVar2[cnum]->bar0;
    } while (*(int *)((long)pvVar1 + 0x400700) != 0);
  }
  return;
}

Assistant:

void pgraph_load_pipe(int cnum, uint32_t addr, uint32_t *data, int num) {
	nva_wr32(cnum, 0x400f50, addr);
	for (int i = 0; i < num; i++)
		nva_wr32(cnum, 0x400f54, data[i]);
	int ctr = 0;
	while (nva_rd32(cnum, 0x400700)) {
		ctr++;
		if (ctr == 10000) {
			printf("PIPE write hang on %04x: %08x\n", addr, nva_rd32(cnum, 0x400700));
		}
	}
}